

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall addrman_tests::getaddr_unfiltered::test_method(getaddr_unfiltered *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  __single_object this_00;
  readonly_property65 rVar2;
  long lVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  assertion_result *paVar6;
  long in_FS_OFFSET;
  const_string file;
  initializer_list<CAddress> __l;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  check_type cVar7;
  undefined8 in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 local_208 [8];
  bool local_200;
  undefined7 uStack_1ff;
  undefined1 *local_1f8;
  char **local_1f0;
  allocator_type local_1e1;
  vector<CAddress,_std::allocator<CAddress>_> local_1e0;
  assertion_result local_1c8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  __single_object addrman;
  undefined1 local_188 [56];
  CAddress local_150;
  CNetAddr source;
  CService local_f8;
  CAddress addr2;
  CService local_98;
  CAddress addr1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_188._0_4_ = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)&addrman,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_188,"250.250.2.1",(allocator<char> *)&addr2);
  ResolveService(&local_98,(string *)local_188,0x208d);
  ipIn.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffffd80;
  ipIn.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)in_stack_fffffffffffffd78;
  ipIn.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffffd88;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffffd90;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  ipIn._32_8_ = in_stack_fffffffffffffd98;
  CAddress::CAddress(&addr1,ipIn,(ServiceFlags)&local_98);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_98);
  std::__cxx11::string::~string((string *)local_188);
  addr1.nTime.__d.__r =
       (duration)
       Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_188,"250.251.2.2",(allocator<char> *)&source);
  ResolveService(&local_f8,(string *)local_188,9999);
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffffd80;
  ipIn_00.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffffd78;
  ipIn_00.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffffd88;
  ipIn_00.super_CNetAddr.m_net = (int)in_stack_fffffffffffffd90;
  ipIn_00.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  ipIn_00._32_8_ = in_stack_fffffffffffffd98;
  CAddress::CAddress(&addr2,ipIn_00,(ServiceFlags)&local_f8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f8);
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_188,"250.1.2.1",(allocator<char> *)local_208);
  ResolveIP(&source,(string *)local_188);
  std::__cxx11::string::~string((string *)local_188);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1bd;
  file.m_begin = (iterator)&local_1a0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b0,msg);
  this_00 = addrman;
  CAddress::CAddress((CAddress *)local_188,&addr1);
  CAddress::CAddress(&local_150,&addr2);
  __l._M_len = 2;
  __l._M_array = (iterator)local_188;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector(&local_1e0,__l,&local_1e1);
  _cVar7 = 0x1f0aa9;
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add((AddrMan *)
                    this_00._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&local_1e0,&source,
                    (seconds)0x0);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = &local_218;
  local_218 = "addrman->Add({addr1, addr2}, source)";
  local_210 = "";
  local_200 = false;
  local_208 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_220 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_208,1,0,WARN,_cVar7,(size_t)&local_228,0x1bd);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_1e0);
  lVar3 = 0x38;
  do {
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)(local_188 + lVar3));
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != -0x38);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1c0;
  file_00.m_begin = (iterator)&local_238;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_248,
             msg_00);
  local_188[8] = '\0';
  local_188._0_8_ = &PTR__lazy_ostream_011480b0;
  local_188._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_188._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_250 = "";
  AddrMan::GetAddr((vector<CAddress,_std::allocator<CAddress>_> *)local_208,
                   (AddrMan *)
                   addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,(optional<Network>)0x0,
                   true);
  local_1c8._0_8_ = (CONCAT71(uStack_1ff,local_200) - (long)local_208) / 0x38;
  paVar6 = &local_1c8;
  local_1e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_188,&local_258,0x1c0,1,2,paVar6,"addrman->GetAddr( 0, 0, std::nullopt).size()",
             &local_1e0,"1U");
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_208);
  file_01.m_end = (iterator)0x1c2;
  file_01.m_begin = &stack0xfffffffffffffd98;
  msg_01.m_end = (iterator)paVar6;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
             (size_t)&stack0xfffffffffffffd88,msg_01);
  local_188[8] = '\0';
  local_188._0_8_ = &PTR__lazy_ostream_011480b0;
  local_188._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_188._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  AddrMan::GetAddr((vector<CAddress,_std::allocator<CAddress>_> *)local_208,
                   (AddrMan *)
                   addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,(optional<Network>)0x0,
                   false);
  local_1c8._0_8_ = (CONCAT71(uStack_1ff,local_200) - (long)local_208) / 0x38;
  local_1e0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_188,&stack0xfffffffffffffd78,0x1c2,1,2,&local_1c8,
             "addrman->GetAddr( 0, 0, std::nullopt, false).size()",&local_1e0,"2U");
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_208);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source.m_addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr2);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr1);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(getaddr_unfiltered)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    // Set time on this addr so isTerrible = false
    CAddress addr1 = CAddress(ResolveService("250.250.2.1", 8333), NODE_NONE);
    addr1.nTime = Now<NodeSeconds>();
    // Not setting time so this addr should be isTerrible = true
    CAddress addr2 = CAddress(ResolveService("250.251.2.2", 9999), NODE_NONE);

    CNetAddr source = ResolveIP("250.1.2.1");
    BOOST_CHECK(addrman->Add({addr1, addr2}, source));

    // Filtered GetAddr should only return addr1
    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt).size(), 1U);
    // Unfiltered GetAddr should return addr1 and addr2
    BOOST_CHECK_EQUAL(addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt, /*filtered=*/false).size(), 2U);
}